

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

Value * __thiscall Json::Value::operator[](Value *this,int index)

{
  Value *pVVar1;
  int in_ESI;
  ArrayIndex in_stack_00000034;
  Value *in_stack_00000038;
  ostringstream oss;
  string local_1b8 [8];
  string *in_stack_fffffffffffffe50;
  ostringstream local_188 [392];
  
  if (in_ESI < 0) {
    std::__cxx11::ostringstream::ostringstream(local_188);
    std::operator<<((ostream *)local_188,
                    "in Json::Value::operator[](int index) const: index cannot be negative");
    std::__cxx11::ostringstream::str();
    throwLogicError(in_stack_fffffffffffffe50);
    std::__cxx11::string::~string(local_1b8);
    abort();
  }
  pVVar1 = operator[](in_stack_00000038,in_stack_00000034);
  return pVVar1;
}

Assistant:

const Value& Value::operator[](int index) const {
  JSON_ASSERT_MESSAGE(
      index >= 0,
      "in Json::Value::operator[](int index) const: index cannot be negative");
  return (*this)[ArrayIndex(index)];
}